

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamHeader::CheckMagicNumber(BamHeader *this,BgzfStream *stream)

{
  size_t sVar1;
  BamException *pBVar2;
  char buffer [4];
  int local_6c;
  string local_68;
  string local_48;
  
  sVar1 = BgzfStream::Read(stream,(char *)&local_6c,4);
  if (sVar1 != 4) {
    pBVar2 = (BamException *)__cxa_allocate_exception(0x28);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"BamHeader::CheckMagicNumber","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"could not read magic number","");
    BamException::BamException(pBVar2,&local_68,&local_48);
    __cxa_throw(pBVar2,&BamException::typeinfo,BamException::~BamException);
  }
  if (local_6c == 0x14d4142) {
    return;
  }
  pBVar2 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamHeader::CheckMagicNumber","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"invalid magic number","");
  BamException::BamException(pBVar2,&local_68,&local_48);
  __cxa_throw(pBVar2,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamHeader::CheckMagicNumber(BgzfStream* stream)
{

    // try to read magic number
    char buffer[Constants::BAM_HEADER_MAGIC_LENGTH];
    const std::size_t numBytesRead = stream->Read(buffer, Constants::BAM_HEADER_MAGIC_LENGTH);
    if (numBytesRead != (int)Constants::BAM_HEADER_MAGIC_LENGTH)
        throw BamException("BamHeader::CheckMagicNumber", "could not read magic number");

    // validate magic number
    if (!isValidMagicNumber(buffer))
        throw BamException("BamHeader::CheckMagicNumber", "invalid magic number");
}